

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaIDCAugPtr_conflict *ppxVar1;
  uint uVar2;
  xmlDocPtr pxVar3;
  xmlSchemaIDCPtr_conflict pxVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  xmlChar *location;
  xmlSchemaValPtr *ppxVar11;
  xmlSchemaElementPtr pxVar12;
  xmlRegExecCtxtPtr exec;
  xmlSchemaElementPtr pxVar13;
  xmlSchemaTypePtr type;
  xmlSchemaTypePtr pxVar14;
  xmlSchemaIDCAugPtr_conflict pxVar15;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlSchemaNodeInfoPtr pxVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  xmlSchemaNodeInfoPtr pxVar20;
  xmlSchemaAttrInfoPtr pxVar21;
  xmlParserErrors xVar22;
  xmlSchemaValidCtxtPtr pctxt;
  char *in_R8;
  int *piVar23;
  byte *name;
  byte *pbVar24;
  xmlSchemaIDCMatcherPtr_conflict pxVar25;
  xmlSchemaIDCMatcherPtr *ppxVar26;
  xmlSchemaIDCPtr_conflict pxVar27;
  xmlSchemaIDCAugPtr_conflict pxVar28;
  int nbval;
  int terminal;
  xmlChar *values [10];
  xmlNodePtr in_stack_ffffffffffffff18;
  xmlNodePtr ctxtNode;
  xmlChar **in_stack_ffffffffffffff20;
  xmlChar *local_b8;
  uint local_a4;
  xmlSchemaPtr local_a0;
  xmlNodePtr local_98;
  uint local_90;
  int local_8c;
  xmlSchemaTypePtr local_88 [11];
  
  iVar8 = (int)in_stack_ffffffffffffff18;
  if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) {
    pcVar18 = "in skip-state";
    goto LAB_001a6691;
  }
  if (vctxt->xsiAssemble != 0) {
    lVar10 = (long)vctxt->nbAttrInfos;
    if (0 < lVar10) {
      lVar17 = 0;
      do {
        pxVar21 = vctxt->attrInfos[lVar17];
        if (pxVar21->metaType == 3) goto LAB_001a636d;
        lVar17 = lVar17 + 1;
      } while (lVar10 != lVar17);
    }
    pxVar21 = (xmlSchemaAttrInfoPtr)0x0;
LAB_001a636d:
    if ((0 < vctxt->nbAttrInfos) && (pxVar21 == (xmlSchemaAttrInfoPtr)0x0)) {
      lVar17 = 0;
      do {
        pxVar21 = vctxt->attrInfos[lVar17];
        if (pxVar21->metaType == 4) goto LAB_001a6395;
        lVar17 = lVar17 + 1;
      } while (lVar10 != lVar17);
      pxVar21 = (xmlSchemaAttrInfoPtr)0x0;
    }
LAB_001a6395:
    if (pxVar21 == (xmlSchemaAttrInfoPtr)0x0) {
      iVar6 = 0;
    }
    else {
      pbVar24 = pxVar21->value;
      local_b8 = (xmlChar *)0x0;
      iVar6 = 0;
      do {
        iVar8 = (int)in_stack_ffffffffffffff18;
        name = pbVar24;
        if (pxVar21->metaType == 3) {
          while (((ulong)*name < 0x21 && ((0x100002600U >> ((ulong)*name & 0x3f) & 1) != 0))) {
            name = name + 1;
          }
          lVar10 = 0;
          while ((0x20 < (ulong)name[lVar10] ||
                 ((0x100002601U >> ((ulong)name[lVar10] & 0x3f) & 1) == 0))) {
            lVar10 = lVar10 + 1;
          }
          if (lVar10 == 0) break;
          pbVar24 = name + lVar10;
          local_b8 = xmlDictLookup(vctxt->schema->dict,name,(int)lVar10);
        }
        while( true ) {
          iVar8 = (int)in_stack_ffffffffffffff18;
          if ((0x20 < (ulong)*pbVar24) || ((0x100002600U >> ((ulong)*pbVar24 & 0x3f) & 1) == 0))
          break;
          pbVar24 = pbVar24 + 1;
        }
        lVar10 = 0;
        while ((0x20 < (ulong)pbVar24[lVar10] ||
               ((0x100002601U >> ((ulong)pbVar24[lVar10] & 0x3f) & 1) == 0))) {
          lVar10 = lVar10 + 1;
        }
        if (lVar10 == 0) {
          if (pxVar21->metaType == 3) {
            iVar8 = 0;
            in_R8 = (char *)0x0;
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_MISC,pxVar21->node,
                       (xmlSchemaTypePtr)
                       "The value must consist of tuples: the target namespace name and the document\'s URI"
                       ,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)in_stack_ffffffffffffff20);
          }
          break;
        }
        location = xmlDictLookup(vctxt->schema->dict,pbVar24,(int)lVar10);
        ctxtNode = pxVar21->node;
        local_88[0] = (xmlSchemaTypePtr)0x0;
        iVar6 = -1;
        if (vctxt->schema == (xmlSchemaPtr)0x0 || vctxt == (xmlSchemaValidCtxtPtr)0x0)
        goto LAB_001a65dd;
        pctxt = (xmlSchemaValidCtxtPtr)vctxt->pctxt;
        if (pctxt == (xmlSchemaValidCtxtPtr)0x0) {
          pcVar18 = "no parser context available";
          pctxt = vctxt;
LAB_001a65c7:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaAssembleByLocation",pcVar18,
                     (xmlChar *)0x0,(xmlChar *)in_R8);
LAB_001a65ce:
          iVar6 = -1;
        }
        else {
          if (pctxt->doc == (xmlDocPtr)0x0) {
            pcVar18 = "no constructor";
            goto LAB_001a65c7;
          }
          local_a0 = vctxt->schema;
          ppxVar11 = (xmlSchemaValPtr *)
                     xmlSchemaBuildAbsoluteURI((xmlDictPtr)pctxt->validationRoot,location,ctxtNode);
          in_stack_ffffffffffffff20 = (xmlChar **)0x0;
          in_R8 = (char *)0x0;
          local_98 = ctxtNode;
          iVar6 = xmlSchemaAddSchemaDoc
                            ((xmlSchemaParserCtxtPtr)pctxt,1,(xmlChar *)ppxVar11,(xmlDocPtr)0x0,
                             (char *)0x0,0,ctxtNode,(xmlChar *)0x0,local_b8,
                             (xmlSchemaBucketPtr_conflict *)local_88);
          in_stack_ffffffffffffff18 = ctxtNode;
          if (iVar6 == 0) {
            if (local_88[0] == (xmlSchemaTypePtr)0x0) {
              in_stack_ffffffffffffff18 = (xmlNodePtr)0x0;
              iVar6 = 0;
              xmlSchemaCustomWarning
                        ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_MISC,local_98,
                         (xmlSchemaTypePtr)"The document at location \'%s\' could not be acquired",
                         (char *)ppxVar11,(xmlChar *)0x0,(xmlChar *)0x0,
                         (xmlChar *)in_stack_ffffffffffffff20);
              in_R8 = (char *)ppxVar11;
              goto LAB_001a65dd;
            }
            if (pctxt->doc->last == (_xmlNode *)0x0) {
              pctxt->doc->last = (_xmlNode *)local_88[0];
            }
            pxVar3 = (xmlDocPtr)local_88[0]->ref;
            iVar6 = 0;
            if ((pxVar3 == (xmlDocPtr)0x0) || (*(int *)((long)&local_88[0]->annot + 4) != 0))
            goto LAB_001a65dd;
            pctxt->serror = (xmlStructuredErrorFunc)0x0;
            pctxt->user_data = pxVar3;
            iVar6 = xmlSchemaParseNewDocWithContext
                              ((xmlSchemaParserCtxtPtr)pctxt,local_a0,
                               (xmlSchemaBucketPtr_conflict)local_88[0]);
            if (iVar6 == 0) {
              if (*(int *)((long)&pctxt->serror + 4) == 0) {
                iVar6 = 0;
              }
              else {
                iVar6 = *(int *)&pctxt->serror;
              }
LAB_001a6636:
              iVar8 = *(int *)((long)&pctxt->serror + 4);
              if (iVar8 == 0) {
                xmlSchemaFixupComponents
                          ((xmlSchemaParserCtxtPtr)pctxt,(xmlSchemaBucketPtr_conflict)local_88[0]);
                iVar6 = *(int *)&pctxt->serror;
                if ((iVar6 != 0) && (vctxt->err == 0)) {
                  vctxt->err = iVar6;
                }
                iVar8 = *(int *)((long)&pctxt->serror + 4);
              }
              vctxt->nberrors = vctxt->nberrors + iVar8;
              pctxt->user_data = (xmlDocPtr)0x0;
              in_stack_ffffffffffffff18 = ctxtNode;
              goto LAB_001a65dd;
            }
            if (iVar6 != -1) goto LAB_001a6636;
            pctxt->user_data = (xmlDocPtr)0x0;
            in_stack_ffffffffffffff18 = ctxtNode;
            goto LAB_001a65ce;
          }
        }
LAB_001a65dd:
        iVar8 = (int)in_stack_ffffffffffffff18;
        if (iVar6 == -1) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaAssembleByXSI","assembling schemata",
                     (xmlChar *)0x0,(xmlChar *)in_R8);
          iVar6 = -1;
          break;
        }
        pbVar24 = pbVar24 + lVar10;
      } while (*pbVar24 != 0);
    }
    if (iVar6 == -1) {
      return -1;
    }
    if (iVar6 != 0) {
      vctxt->skipDepth = 0;
      return iVar6;
    }
    xmlHashScan(vctxt->schema->schemasImports,xmlSchemaAugmentImportedIDC,vctxt);
  }
  if (0 < (long)vctxt->depth) {
    pxVar20 = vctxt->elemInfos[(long)vctxt->depth + -1];
    if ((pxVar20->flags & 0x20U) != 0) {
      pxVar20->flags = pxVar20->flags & 0xffffffdf;
    }
    if ((pxVar20->flags & 4) == 0) {
      pxVar14 = pxVar20->typeDef;
      if (pxVar14->builtInType == 0x2d) {
        pxVar12 = xmlSchemaGetElem(vctxt->schema,vctxt->inode->localName,vctxt->inode->nsName);
        pxVar20 = vctxt->inode;
        pxVar20->decl = pxVar12;
        if (pxVar12 == (xmlSchemaElementPtr)0x0) {
          if (0 < (long)vctxt->nbAttrInfos) {
            lVar10 = 0;
            do {
              pxVar21 = vctxt->attrInfos[lVar10];
              if (pxVar21->metaType == 1) goto LAB_001a67bb;
              lVar10 = lVar10 + 1;
            } while (vctxt->nbAttrInfos != lVar10);
          }
          pxVar21 = (xmlSchemaAttrInfoPtr)0x0;
LAB_001a67bb:
          if (pxVar21 == (xmlSchemaAttrInfoPtr)0x0) {
            pxVar14 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
            pxVar16 = vctxt->inode;
            pxVar16->typeDef = pxVar14;
LAB_001a6a62:
            iVar6 = (int)pxVar16;
            bVar5 = true;
          }
          else {
            bVar5 = false;
            pxVar16 = (xmlSchemaNodeInfoPtr)0x0;
            iVar6 = xmlSchemaProcessXSIType
                              (vctxt,pxVar21,&pxVar20->typeDef,(xmlSchemaElementPtr)0x0);
            if (iVar6 == 0) goto LAB_001a6a62;
            if (iVar6 == -1) {
              bVar5 = false;
              xmlSchemaInternalErr2
                        ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateChildElem",
                         "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:nil\'",
                         (xmlChar *)0x0,(xmlChar *)in_R8);
              iVar6 = -1;
            }
          }
          if (!bVar5) goto switchD_001a6903_caseD_5;
        }
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        switch(pxVar14->contentType) {
        case XML_SCHEMA_CONTENT_EMPTY:
          vctxt->inode = pxVar20;
          in_R8 = "Element content is not allowed, because the content type is empty";
          iVar9 = 0x731;
          xVar22 = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1;
          goto LAB_001a6899;
        case XML_SCHEMA_CONTENT_ELEMENTS:
        case XML_SCHEMA_CONTENT_MIXED:
          local_a4 = 10;
          if (pxVar14->contModel == (xmlRegexpPtr)0x0) {
            pcVar18 = "type has elem content but no content model";
LAB_001a6a84:
            iVar9 = 0;
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateChildElem",pcVar18,
                       (xmlChar *)0x0,(xmlChar *)in_R8);
            iVar7 = 1;
          }
          else {
            if ((pxVar20->flags & 0x100) != 0) {
              pcVar18 = "validating elem, but elem content is already invalid";
              goto LAB_001a6a84;
            }
            exec = pxVar20->regexCtxt;
            if (exec == (xmlRegExecCtxtPtr)0x0) {
              exec = xmlRegNewExecCtxt(pxVar14->contModel,xmlSchemaVContentModelCallback,vctxt);
              if (exec == (xmlRegExecCtxtPtr)0x0) {
                pcVar18 = "failed to create a regex context";
                goto LAB_001a6a84;
              }
              pxVar20->regexCtxt = exec;
            }
            pxVar16 = vctxt->inode;
            iVar6 = xmlRegExecPushString2(exec,pxVar16->localName,pxVar16->nsName,pxVar16);
            if (vctxt->err == 0x71a) {
              xmlSchemaInternalErr2
                        ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateChildElem",
                         "calling xmlRegExecPushString2()",(xmlChar *)0x0,(xmlChar *)in_R8);
              iVar7 = 1;
              iVar9 = iVar6;
            }
            else {
              iVar9 = 0;
              iVar7 = 0;
              if (iVar6 < 0) {
                in_R8 = (char *)local_88;
                piVar23 = &local_8c;
                xmlRegExecErrInfo(exec,(xmlChar **)0x0,(int *)&local_a4,(int *)&local_90,
                                  (xmlChar **)in_R8,piVar23);
                xmlSchemaComplexTypeErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,0x1e7338,(xmlNodePtr)(ulong)local_a4,
                           (xmlSchemaTypePtr)(ulong)local_90,in_R8,(int)piVar23,iVar8,
                           in_stack_ffffffffffffff20);
                iVar9 = vctxt->err;
                iVar7 = 2;
              }
            }
          }
          iVar6 = iVar9;
          if ((iVar7 != 0) && (iVar6 = -1, iVar7 == 2)) goto LAB_001a68be;
          break;
        case XML_SCHEMA_CONTENT_SIMPLE:
        case XML_SCHEMA_CONTENT_BASIC:
          vctxt->inode = pxVar20;
          if (pxVar14->type == XML_SCHEMA_TYPE_COMPLEX) {
            in_R8 = 
            "Element content is not allowed, because the content type is a simple type definition";
            xVar22 = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_2;
          }
          else {
            in_R8 = "Element content is not allowed, because the type definition is simple";
            xVar22 = XML_SCHEMAV_CVC_TYPE_3_1_2;
          }
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlNodePtr)0x0,
                              (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,(xmlChar *)0x0,
                              (xmlChar *)0x0,(xmlChar *)0x0);
          vctxt->inode = vctxt->elemInfos[vctxt->depth];
          iVar9 = vctxt->err;
          goto LAB_001a68be;
        }
      }
    }
    else {
      vctxt->inode = pxVar20;
      in_R8 = "Neither character nor element content is allowed, because the element was \'nilled\'"
      ;
      iVar9 = 0x738;
      xVar22 = XML_SCHEMAV_CVC_ELT_3_2_1;
LAB_001a6899:
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0);
      vctxt->inode = vctxt->elemInfos[vctxt->depth];
LAB_001a68be:
      vctxt->skipDepth = vctxt->depth;
      piVar23 = &vctxt->inode->flags;
      *piVar23 = *piVar23 | 0x200;
      pbVar24 = (byte *)((long)&pxVar20->flags + 1);
      *pbVar24 = *pbVar24 | 1;
      iVar6 = iVar9;
    }
switchD_001a6903_caseD_5:
    if (iVar6 != 0) {
      if (iVar6 < 0) {
        pcVar18 = "calling xmlSchemaStreamValidateChildElement()";
        goto LAB_001a6691;
      }
      goto LAB_001a6ecb;
    }
    if (vctxt->depth != vctxt->skipDepth) {
      if ((vctxt->inode->decl == (xmlSchemaElementPtr)0x0) &&
         (vctxt->inode->typeDef == (xmlSchemaTypePtr)0x0)) {
        pcVar18 = "the child element was valid but neither the declaration nor the type was set";
        goto LAB_001a6691;
      }
      goto LAB_001a6b07;
    }
    goto LAB_001a6e6a;
  }
  pxVar12 = xmlSchemaGetElem(vctxt->schema,vctxt->inode->localName,vctxt->inode->nsName);
  vctxt->inode->decl = pxVar12;
  if (pxVar12 != (xmlSchemaElementPtr)0x0) {
LAB_001a6b07:
    pxVar20 = vctxt->inode;
    pxVar12 = pxVar20->decl;
    iVar8 = 0;
    if (pxVar12 != (xmlSchemaElementPtr)0x0) {
      if (pxVar12->type == XML_SCHEMA_TYPE_ANY) {
        iVar8 = *(int *)&pxVar12->refNs;
        if (iVar8 == 1) {
LAB_001a6b56:
          iVar6 = 0;
        }
        else {
          pxVar13 = xmlSchemaGetElem(vctxt->schema,pxVar20->localName,pxVar20->nsName);
          if (pxVar13 != (xmlSchemaElementPtr)0x0) {
            vctxt->inode->decl = pxVar13;
            goto LAB_001a6b56;
          }
          if (*(int *)&pxVar12->refNs != 3) {
            uVar2 = vctxt->nbAttrInfos;
            if ((ulong)uVar2 != 0) {
              iVar6 = 0;
              if (0 < (int)uVar2) {
                uVar19 = 0;
                do {
                  pxVar21 = vctxt->attrInfos[uVar19];
                  if (pxVar21->metaType == 1) goto LAB_001a6fbf;
                  uVar19 = uVar19 + 1;
                } while (uVar2 != uVar19);
              }
              pxVar21 = (xmlSchemaAttrInfoPtr)0x0;
LAB_001a6fbf:
              if (pxVar21 != (xmlSchemaAttrInfoPtr)0x0) {
                iVar6 = 0;
                iVar9 = xmlSchemaProcessXSIType
                                  (vctxt,pxVar21,&vctxt->inode->typeDef,(xmlSchemaElementPtr)0x0);
                if (iVar9 == -1) {
                  xmlSchemaInternalErr2
                            ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElemWildcard",
                             "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:nil\'"
                             ,(xmlChar *)0x0,(xmlChar *)in_R8);
                  iVar6 = -1;
                }
              }
              if (pxVar21 != (xmlSchemaAttrInfoPtr)0x0) goto LAB_001a6b58;
            }
            pxVar14 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
            vctxt->inode->typeDef = pxVar14;
            goto LAB_001a6b56;
          }
          in_R8 = 
          "No matching global element declaration available, but demanded by the strict wildcard";
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                              (xmlSchemaBasicItemPtr)0x0,
                              "No matching global element declaration available, but demanded by the strict wildcard"
                              ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          iVar6 = vctxt->err;
        }
LAB_001a6b58:
        if (iVar6 == 0) {
          if (iVar8 == 1) {
            vctxt->skipDepth = vctxt->depth;
            iVar9 = 3;
          }
          else {
            iVar9 = 0;
            if (vctxt->inode->decl->type != XML_SCHEMA_TYPE_ELEMENT) {
              vctxt->inode->decl = (xmlSchemaElementPtr)0x0;
              iVar9 = 4;
            }
          }
        }
        else {
          iVar9 = 3;
          if (iVar6 < 0) {
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElem",
                       "calling xmlSchemaValidateElemWildcard()",(xmlChar *)0x0,(xmlChar *)in_R8);
            iVar9 = 2;
          }
        }
        iVar8 = iVar6;
        if (iVar9 == 4) goto LAB_001a6db6;
        if (iVar9 == 3) goto LAB_001a6ecb;
        if (iVar9 != 0) {
          return -1;
        }
      }
      pxVar12 = vctxt->inode->decl;
      if (pxVar12 == (xmlSchemaElementPtr)0x0) {
        in_R8 = "No matching declaration available";
        xVar22 = XML_SCHEMAV_CVC_ELT_1;
      }
      else {
        if ((pxVar12->flags & 0x10) == 0) {
          pxVar14 = pxVar12->subtypes;
          if (pxVar14 == (xmlSchemaTypePtr)0x0) {
            in_R8 = "The type definition is absent";
            iVar6 = 0x753;
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_1,
                                (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                                "The type definition is absent",(xmlChar *)0x0,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            uVar2 = vctxt->nbAttrInfos;
            if ((ulong)uVar2 != 0) {
              if (0 < (int)uVar2) {
                uVar19 = 0;
                do {
                  pxVar20 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[uVar19];
                  if (*(int *)&pxVar20->field_0x5c == 2) goto LAB_001a6c99;
                  uVar19 = uVar19 + 1;
                } while (uVar2 != uVar19);
              }
              pxVar20 = (xmlSchemaNodeInfoPtr)0x0;
LAB_001a6c99:
              if (pxVar20 == (xmlSchemaNodeInfoPtr)0x0) {
LAB_001a710c:
                if (0 < (long)vctxt->nbAttrInfos) {
                  lVar10 = 0;
                  do {
                    pxVar21 = vctxt->attrInfos[lVar10];
                    if (pxVar21->metaType == 1) goto LAB_001a713a;
                    lVar10 = lVar10 + 1;
                  } while (vctxt->nbAttrInfos != lVar10);
                }
                pxVar21 = (xmlSchemaAttrInfoPtr)0x0;
LAB_001a713a:
                if (pxVar21 == (xmlSchemaAttrInfoPtr)0x0) {
                  bVar5 = true;
                }
                else {
                  local_88[0] = (xmlSchemaTypePtr)0x0;
                  iVar8 = xmlSchemaProcessXSIType(vctxt,pxVar21,local_88,pxVar12);
                  bVar5 = iVar8 != -1;
                  if (iVar8 == -1) {
                    pcVar18 = 
                    "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:type\'";
                    goto LAB_001a7194;
                  }
                  if (local_88[0] != (xmlSchemaTypePtr)0x0) {
                    piVar23 = &vctxt->inode->flags;
                    *piVar23 = *piVar23 | 8;
                    pxVar14 = local_88[0];
                  }
                }
              }
              else {
                vctxt->inode = pxVar20;
                type = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
                ppxVar11 = &pxVar20->val;
                in_R8 = (char *)ppxVar11;
                iVar8 = xmlSchemaVCheckCVCSimpleType
                                  ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,type,
                                   pxVar20->value,ppxVar11,1,0,0);
                vctxt->inode = vctxt->elemInfos[vctxt->depth];
                if (-1 < iVar8) {
                  if (iVar8 == 0) {
                    if ((pxVar12->flags & 1) == 0) {
                      in_R8 = "The element is not \'nillable\'";
                      xVar22 = XML_SCHEMAV_CVC_ELT_3_1;
LAB_001a6d32:
                      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlNodePtr)0x0,
                                          (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,
                                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
                    }
                    else {
                      iVar8 = xmlSchemaValueGetAsBoolean(*ppxVar11);
                      if (iVar8 != 0) {
                        if (((pxVar12->flags & 8) != 0) && (pxVar12->value != (xmlChar *)0x0)) {
                          in_R8 = 
                          "The element cannot be \'nilled\' because there is a fixed value constraint defined for it"
                          ;
                          xVar22 = XML_SCHEMAV_CVC_ELT_3_2_2;
                          goto LAB_001a6d32;
                        }
                        piVar23 = &vctxt->inode->flags;
                        *piVar23 = *piVar23 | 4;
                      }
                    }
                  }
                  goto LAB_001a710c;
                }
                pcVar18 = 
                "calling xmlSchemaVCheckCVCSimpleType() to validate the attribute \'xsi:nil\'";
                bVar5 = false;
LAB_001a7194:
                xmlSchemaInternalErr2
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElemDecl",pcVar18,
                           (xmlChar *)0x0,(xmlChar *)in_R8);
              }
              iVar6 = -1;
              if (!bVar5) goto LAB_001a6d97;
            }
            pxVar27 = (xmlSchemaIDCPtr_conflict)pxVar12->idcs;
            if (pxVar27 != (xmlSchemaIDCPtr_conflict)0x0) {
              if (vctxt->inode->idcMatchers != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
                pcVar18 = "The chain of IDC matchers is expected to be empty";
                goto LAB_001a7355;
              }
              ppxVar1 = &vctxt->aidcs;
              pxVar25 = (xmlSchemaIDCMatcherPtr_conflict)0x0;
              do {
                pxVar28 = (xmlSchemaIDCAugPtr_conflict)ppxVar1;
                if ((pxVar27->type == XML_SCHEMA_TYPE_IDC_KEYREF) &&
                   (pxVar4 = (xmlSchemaIDCPtr_conflict)pxVar27->ref->item,
                   pxVar4 != (xmlSchemaIDCPtr_conflict)0x0)) {
                  vctxt->inode->hasKeyrefs = 1;
                  pxVar15 = (xmlSchemaIDCAugPtr_conflict)ppxVar1;
                  do {
                    pxVar15 = pxVar15->next;
                    if (pxVar15 == (xmlSchemaIDCAugPtr_conflict)0x0) goto LAB_001a7342;
                  } while (pxVar15->def != pxVar4);
                  if ((pxVar15->keyrefDepth == -1) || (vctxt->depth < pxVar15->keyrefDepth)) {
                    pxVar15->keyrefDepth = vctxt->depth;
                  }
                }
                do {
                  pxVar28 = pxVar28->next;
                  if (pxVar28 == (xmlSchemaIDCAugPtr_conflict)0x0) goto LAB_001a7342;
                } while (pxVar28->def != pxVar27);
                matcher = vctxt->idcMatcherCache;
                if (matcher == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
                  matcher = (xmlSchemaIDCMatcherPtr_conflict)(*xmlMalloc)(0x48);
                  if (matcher == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
                    xmlSchemaVErrMemory(vctxt);
                    goto LAB_001a735c;
                  }
                  *(undefined8 *)&matcher->sizeKeySeqs = 0;
                  matcher->targets = (xmlSchemaItemListPtr)0x0;
                  *(undefined8 *)&matcher->idcType = 0;
                  matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)0x0;
                  matcher->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
                  matcher->aidc = (xmlSchemaIDCAugPtr_conflict)0x0;
                  matcher->type = 0;
                  matcher->depth = 0;
                  matcher->next = (xmlSchemaIDCMatcherPtr)0x0;
                  matcher->htab = (xmlHashTablePtr)0x0;
                }
                else {
                  vctxt->idcMatcherCache = matcher->nextCached;
                  matcher->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
                }
                if (pxVar25 == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
                  ppxVar26 = &vctxt->inode->idcMatchers;
                }
                else {
                  ppxVar26 = &pxVar25->next;
                }
                *ppxVar26 = matcher;
                matcher->type = 0;
                matcher->depth = vctxt->depth;
                matcher->aidc = pxVar28;
                matcher->idcType = pxVar28->def->type;
                iVar8 = xmlSchemaIDCAddStateObject(vctxt,matcher,pxVar27->selector,1);
                if (iVar8 == -1) goto LAB_001a735c;
                pxVar27 = pxVar27->next;
                pxVar25 = matcher;
              } while (pxVar27 != (xmlSchemaIDCPtr)0x0);
            }
            vctxt->inode->typeDef = pxVar14;
            iVar6 = 0;
          }
          goto LAB_001a6d97;
        }
        in_R8 = "The element declaration is abstract";
        xVar22 = XML_SCHEMAV_CVC_ELT_2;
      }
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0);
      iVar6 = vctxt->err;
      goto LAB_001a6d97;
    }
    goto LAB_001a6db6;
  }
  pcVar18 = "No matching global declaration available for the validation root";
  iVar6 = 0x735;
  xVar22 = XML_SCHEMAV_CVC_ELT_1;
LAB_001a6ebf:
  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlNodePtr)0x0,
                      (xmlSchemaBasicItemPtr)0x0,pcVar18,(xmlChar *)0x0,(xmlChar *)0x0,
                      (xmlChar *)0x0,(xmlChar *)0x0);
LAB_001a6ecb:
  if (iVar6 != 0) {
    vctxt->skipDepth = vctxt->depth;
  }
  return iVar6;
LAB_001a7342:
  pcVar18 = "Could not find an augmented IDC item for an IDC definition";
LAB_001a7355:
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaIDCRegisterMatchers",pcVar18,(xmlChar *)0x0,
             (xmlChar *)in_R8);
LAB_001a735c:
  iVar6 = -1;
LAB_001a6d97:
  iVar8 = 0;
  if (iVar6 != 0) {
    if (iVar6 < 0) {
      pcVar18 = "calling xmlSchemaValidateElemDecl()";
      goto LAB_001a6691;
    }
    goto LAB_001a6ecb;
  }
LAB_001a6db6:
  pxVar20 = vctxt->inode;
  if (pxVar20->typeDef == (xmlSchemaTypePtr)0x0) {
    pbVar24 = (byte *)((long)&pxVar20->flags + 1);
    *pbVar24 = *pbVar24 | 4;
    pcVar18 = "The type definition is absent";
    iVar6 = 0x753;
    xVar22 = XML_SCHEMAV_CVC_TYPE_1;
  }
  else {
    if ((pxVar20->typeDef->flags & 0x100000) == 0) {
      if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
        iVar8 = xmlSchemaXPathEvaluate(vctxt,XML_ELEMENT_NODE);
        vctxt->inode->appliedXPath = 1;
        if (iVar8 == -1) {
          pcVar18 = "calling xmlSchemaXPathEvaluate()";
          goto LAB_001a6691;
        }
      }
      pxVar14 = vctxt->inode->typeDef;
      if ((pxVar14->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar14->builtInType == 0x2d)) {
        if ((vctxt->nbAttrInfos != 0) || (pxVar14->attrUses != (void *)0x0)) {
          iVar8 = xmlSchemaVAttributesComplex(vctxt);
        }
      }
      else if (vctxt->nbAttrInfos != 0) {
        iVar8 = xmlSchemaVAttributesSimple(vctxt);
      }
      if (vctxt->nbAttrInfos != 0) {
        xmlSchemaClearAttrInfos(vctxt);
      }
      if (iVar8 == -1) {
        pcVar18 = "calling attributes validation";
LAB_001a6691:
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElem",pcVar18,(xmlChar *)0x0,
                   (xmlChar *)in_R8);
        return -1;
      }
LAB_001a6e6a:
      iVar6 = 0;
      goto LAB_001a6ecb;
    }
    pbVar24 = (byte *)((long)&pxVar20->flags + 1);
    *pbVar24 = *pbVar24 | 4;
    pcVar18 = "The type definition is abstract";
    iVar6 = 0x754;
    xVar22 = XML_SCHEMAV_CVC_TYPE_2;
  }
  goto LAB_001a6ebf;
}

Assistant:

static int
xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if ((vctxt->skipDepth != -1) &&
	(vctxt->depth >= vctxt->skipDepth)) {
	VERROR_INT("xmlSchemaValidateElem",
	    "in skip-state");
	goto internal_error;
    }
    if (vctxt->xsiAssemble) {
	/*
	* We will stop validation if there was an error during
	* dynamic schema construction.
	* Note that we simply set @skipDepth to 0, this could
	* mean that a streaming document via SAX would be
	* still read to the end but it won't be validated any more.
	* TODO: If we are sure how to stop the validation at once
	*   for all input scenarios, then this should be changed to
	*   instantly stop the validation.
	*/
	ret = xmlSchemaAssembleByXSI(vctxt);
	if (ret != 0) {
	    if (ret == -1)
		goto internal_error;
	    vctxt->skipDepth = 0;
	    return(ret);
	}
        /*
         * Augment the IDC definitions for the main schema and all imported ones
         * NOTE: main schema is the first in the imported list
         */
        xmlHashScan(vctxt->schema->schemasImports, xmlSchemaAugmentImportedIDC,
                    vctxt);
    }
    if (vctxt->depth > 0) {
	/*
	* Validate this element against the content model
	* of the parent.
	*/
	ret = xmlSchemaValidateChildElem(vctxt);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaStreamValidateChildElement()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (vctxt->depth == vctxt->skipDepth)
	    goto exit;
	if ((vctxt->inode->decl == NULL) &&
	    (vctxt->inode->typeDef == NULL)) {
	    VERROR_INT("xmlSchemaValidateElem",
		"the child element was valid but neither the "
		"declaration nor the type was set");
	    goto internal_error;
	}
    } else {
	/*
	* Get the declaration of the validation root.
	*/
	vctxt->inode->decl = xmlSchemaGetElem(vctxt->schema,
	    vctxt->inode->localName,
	    vctxt->inode->nsName);
	if (vctxt->inode->decl == NULL) {
	    ret = XML_SCHEMAV_CVC_ELT_1;
	    VERROR(ret, NULL,
		"No matching global declaration available "
		"for the validation root");
	    goto exit;
	}
    }

    if (vctxt->inode->decl == NULL)
	goto type_validation;

    if (vctxt->inode->decl->type == XML_SCHEMA_TYPE_ANY) {
	int skip;
	/*
	* Wildcards.
	*/
	ret = xmlSchemaValidateElemWildcard(vctxt, &skip);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaValidateElemWildcard()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (skip) {
	    vctxt->skipDepth = vctxt->depth;
	    goto exit;
	}
	/*
	* The declaration might be set by the wildcard validation,
	* when the processContents is "lax" or "strict".
	*/
	if (vctxt->inode->decl->type != XML_SCHEMA_TYPE_ELEMENT) {
	    /*
	    * Clear the "decl" field to not confuse further processing.
	    */
	    vctxt->inode->decl = NULL;
	    goto type_validation;
	}
    }
    /*
    * Validate against the declaration.
    */
    ret = xmlSchemaValidateElemDecl(vctxt);
    if (ret != 0) {
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaValidateElemDecl()");
	    goto internal_error;
	}
	goto exit;
    }
    /*
    * Validate against the type definition.
    */
type_validation:

    if (vctxt->inode->typeDef == NULL) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_1;
	VERROR(ret, NULL,
	    "The type definition is absent");
	goto exit;
    }
    if (vctxt->inode->typeDef->flags & XML_SCHEMAS_TYPE_ABSTRACT) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_2;
	    VERROR(ret, NULL,
	    "The type definition is abstract");
	goto exit;
    }
    /*
    * Evaluate IDCs. Do it here, since new IDC matchers are registered
    * during validation against the declaration. This must be done
    * _before_ attribute validation.
    */
    if (vctxt->xpathStates != NULL) {
	ret = xmlSchemaXPathEvaluate(vctxt, XML_ELEMENT_NODE);
	vctxt->inode->appliedXPath = 1;
	if (ret == -1) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaXPathEvaluate()");
	    goto internal_error;
	}
    }
    /*
    * Validate attributes.
    */
    if (WXS_IS_COMPLEX(vctxt->inode->typeDef)) {
	if ((vctxt->nbAttrInfos != 0) ||
	    (vctxt->inode->typeDef->attrUses != NULL)) {

	    ret = xmlSchemaVAttributesComplex(vctxt);
	}
    } else if (vctxt->nbAttrInfos != 0) {

	ret = xmlSchemaVAttributesSimple(vctxt);
    }
    /*
    * Clear registered attributes.
    */
    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (ret == -1) {
	VERROR_INT("xmlSchemaValidateElem",
	    "calling attributes validation");
	goto internal_error;
    }
    /*
    * Don't return an error if attributes are invalid on purpose.
    */
    ret = 0;

exit:
    if (ret != 0)
	vctxt->skipDepth = vctxt->depth;
    return (ret);
internal_error:
    return (-1);
}